

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

void __thiscall wirehair::Codec::PeelDiagonal(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  uint uVar5;
  void *__dest;
  void *__src;
  ushort *puVar6;
  long lVar7;
  ulong uVar8;
  uint *in_RDI;
  uint8_t *block_src_1;
  uint8_t *temp_block_dest;
  uint16_t ref_column_i;
  PeelRow *ref_row;
  uint j;
  uint64_t *ge_ref_row;
  uint16_t ref_row_i;
  uint count;
  uint i_1;
  uint16_t *referencingRows;
  PeelRefs *refs;
  uint8_t *block_src;
  uint8_t *temp_block_src;
  uint ge_column_k;
  uint ge_column_j;
  uint ge_column_i;
  RowMixIterator mix;
  uint defer_count;
  uint64_t *ge_row;
  uint16_t peel_column_i;
  uint16_t peel_row_i;
  PeelRow *row;
  uint i;
  uint16_t x;
  uint16_t distanceToP;
  int in_stack_0000013c;
  void *in_stack_00000140;
  void *in_stack_00000148;
  uint local_a4;
  uint local_8c;
  ushort local_5a [3];
  uint local_54;
  long local_50;
  ushort local_44;
  ushort local_42;
  long local_40;
  uint local_2c;
  ushort local_26;
  ushort local_24;
  ushort local_22;
  long local_20;
  ushort *local_18;
  ushort local_10;
  ushort local_e;
  ushort local_c;
  ushort local_a;
  ushort *local_8;
  
  local_42 = (ushort)in_RDI[0x22];
  while (local_42 != 0xffff) {
    local_40 = *(long *)(in_RDI + 0x18) + (ulong)local_42 * 0x18;
    local_44 = *(ushort *)(local_40 + 0x12);
    local_50 = *(long *)(in_RDI + 0x24) + (ulong)(in_RDI[0x2a] * (uint)local_42) * 8;
    local_54 = (uint)*(ushort *)((long)in_RDI + 0x8e);
    local_20 = local_40 + 6;
    local_22 = (ushort)in_RDI[6];
    local_24 = *(ushort *)((long)in_RDI + 0x1a);
    local_18 = local_5a;
    uVar1 = *(ushort *)(local_40 + 0xc);
    local_26 = uVar1;
    for (local_2c = 1; local_2c < 3; local_2c = local_2c + 1) {
      local_e = *(ushort *)(local_40 + 0xe);
      local_8 = &local_26;
      local_26 = (ushort)((ulong)((uint)local_26 + (uint)local_e) % (ulong)(long)(int)(uint)local_24
                         );
      if (local_22 <= local_26) {
        local_10 = local_24 - local_26;
        if (local_e < local_10) {
          local_26 = (ushort)(((uint)local_e * 0x10000 - (uint)local_10) % (uint)local_e);
        }
        else {
          local_26 = local_e - local_10;
        }
      }
      local_18[local_2c] = local_26;
      local_c = local_24;
      local_a = local_22;
    }
    uVar5 = local_54 + uVar1;
    uVar8 = (ulong)(uVar5 >> 6);
    *(ulong *)(local_50 + uVar8 * 8) = 1L << ((byte)uVar5 & 0x3f) ^ *(ulong *)(local_50 + uVar8 * 8)
    ;
    uVar8 = (ulong)(local_54 + local_5a[1] >> 6);
    *(ulong *)(local_50 + uVar8 * 8) =
         1L << ((byte)(local_54 + local_5a[1]) & 0x3f) ^ *(ulong *)(local_50 + uVar8 * 8);
    uVar8 = (ulong)(local_54 + local_5a[2] >> 6);
    *(ulong *)(local_50 + uVar8 * 8) =
         1L << ((byte)(local_54 + local_5a[2]) & 0x3f) ^ *(ulong *)(local_50 + uVar8 * 8);
    __dest = (void *)(*(long *)(in_RDI + 8) + (ulong)(*in_RDI * (uint)local_44));
    if (*(char *)(local_40 + 0x14) == '\0') {
      __src = (void *)(*(long *)(in_RDI + 0xc) + (ulong)(*in_RDI * (uint)local_42));
      if ((uint)local_42 == (ushort)in_RDI[1] - 1) {
        memcpy(__dest,__src,(ulong)in_RDI[0xe]);
        memset((void *)((long)__dest + (ulong)in_RDI[0xe]),0,(ulong)(*in_RDI - in_RDI[0xe]));
      }
      else {
        memcpy(__dest,__src,(ulong)*in_RDI);
      }
    }
    puVar6 = (ushort *)(*(long *)(in_RDI + 0x1c) + (ulong)local_44 * 0x42);
    local_8c = 0;
    uVar1 = *puVar6;
    for (; local_8c < uVar1; local_8c = local_8c + 1) {
      uVar2 = puVar6[(ulong)local_8c + 1];
      if (uVar2 != local_42) {
        lVar7 = *(long *)(in_RDI + 0x24) + (ulong)(in_RDI[0x2a] * (uint)uVar2) * 8;
        for (local_a4 = 0; local_a4 < in_RDI[0x2a]; local_a4 = local_a4 + 1) {
          *(ulong *)(lVar7 + (ulong)local_a4 * 8) =
               *(ulong *)(local_50 + (ulong)local_a4 * 8) ^ *(ulong *)(lVar7 + (ulong)local_a4 * 8);
        }
        lVar7 = *(long *)(in_RDI + 0x18) + (ulong)uVar2 * 0x18;
        uVar3 = *(ushort *)(lVar7 + 0x12);
        if (uVar3 != 0xffff) {
          lVar4 = *(long *)(in_RDI + 8);
          uVar5 = *in_RDI;
          if (*(char *)(lVar7 + 0x14) == '\0') {
            if ((uint)uVar2 == (ushort)in_RDI[1] - 1) {
              gf256_addset_mem(temp_block_src,block_src,refs,referencingRows._4_4_);
              memcpy((void *)(lVar4 + (ulong)(uVar5 * uVar3) + (ulong)in_RDI[0xe]),
                     (void *)((long)__dest + (ulong)in_RDI[0xe]),(ulong)(*in_RDI - in_RDI[0xe]));
            }
            else {
              gf256_addset_mem(temp_block_src,block_src,refs,referencingRows._4_4_);
            }
            *(undefined1 *)(lVar7 + 0x14) = 1;
          }
          else {
            gf256_add_mem(in_stack_00000148,in_stack_00000140,in_stack_0000013c);
          }
        }
      }
    }
    local_42 = *(ushort *)(local_40 + 4);
  }
  return;
}

Assistant:

void Codec::PeelDiagonal()
{
    CAT_IF_DUMP(cout << endl << "---- PeelDiagonal ----" << endl << endl;)

    /*
        This function optimizes the block value generation by combining the first
        memcpy and memxor operations together into a three-way memxor if possible,
        using the is_copied row member.
    */

    CAT_IF_ROWOP(unsigned rowops = 0;)

    PeelRow * GF256_RESTRICT row;

    // For each peeled row in forward solution order:
    for (uint16_t peel_row_i = _peel_head_rows;
        peel_row_i != LIST_TERM;
        peel_row_i = row->NextRow)
    {
        row = &_peel_rows[peel_row_i];

        // Lookup peeling results
        const uint16_t peel_column_i = row->Marks.Result.PeelColumn;
        uint64_t *ge_row = _compress_matrix + _ge_pitch * peel_row_i;

        CAT_IF_DUMP(cout << "Peeled row " << peel_row_i << " for peeled column " << peel_column_i << " :";)

        const unsigned defer_count = _defer_count;
        const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

        // Generate mixing column 1
        const unsigned ge_column_i = defer_count + mix.Columns[0];
        ge_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
        CAT_IF_DUMP(cout << " " << ge_column_i;)

        // Generate mixing column 2
        const unsigned ge_column_j = defer_count + mix.Columns[1];
        ge_row[ge_column_j >> 6] ^= (uint64_t)1 << (ge_column_j & 63);
        CAT_IF_DUMP(cout << " " << ge_column_j;)

        // Generate mixing column 3
        const unsigned ge_column_k = defer_count + mix.Columns[2];
        ge_row[ge_column_k >> 6] ^= (uint64_t)1 << (ge_column_k & 63);
        CAT_IF_DUMP(cout << " " << ge_column_k << endl;)

        // Get pointer to output block
        CAT_DEBUG_ASSERT(peel_column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT temp_block_src = _recovery_blocks + _block_bytes * peel_column_i;

        // If row has not been copied yet:
        if (!row->Marks.Result.IsCopied)
        {
            const uint8_t * GF256_RESTRICT block_src = _input_blocks + _block_bytes * peel_row_i;

            // If this is not the last block:
            if (peel_row_i != _block_count - 1) {
                // Copy it directly to the output block
                memcpy(temp_block_src, block_src, _block_bytes);
            }
            else
            {
                // Copy with zero padding
                memcpy(temp_block_src, block_src, _input_final_bytes);
                CAT_DEBUG_ASSERT(_block_bytes >= _input_final_bytes);
                memset(temp_block_src + _input_final_bytes, 0, _block_bytes - _input_final_bytes);
            }
            CAT_IF_ROWOP(++rowops;)

            CAT_IF_DUMP(cout << "-- Copied from " << peel_row_i <<
                " because has not been copied yet.  Output block = " <<
                (unsigned)temp_block_src[0] << endl;)

            // Note that we do not need to set is_copied here because no
            // further rows reference this one
        }

        CAT_IF_DUMP(cout << "++ Adding to referencing rows:";)

        PeelRefs * GF256_RESTRICT refs = &_peel_col_refs[peel_column_i];
        const uint16_t * GF256_RESTRICT referencingRows = refs->Rows;

        // For each row that references this one:
        for (unsigned i = 0, count = refs->RowCount; i < count; ++i)
        {
            const uint16_t ref_row_i = referencingRows[i];

            // If it references the current row:
            if (ref_row_i == peel_row_i) {
                // Skip this row
                continue;
            }

            CAT_IF_DUMP(cout << " " << ref_row_i;)

            uint64_t * GF256_RESTRICT ge_ref_row = _compress_matrix + _ge_pitch * ref_row_i;

            // Add GE row to referencing GE row
            for (unsigned j = 0; j < _ge_pitch; ++j) {
                ge_ref_row[j] ^= ge_row[j];
            }

            PeelRow * GF256_RESTRICT ref_row = &_peel_rows[ref_row_i];
            const uint16_t ref_column_i = ref_row->Marks.Result.PeelColumn;

            // If row is peeled:
            if (ref_column_i != LIST_TERM)
            {
                // Generate temporary row block value:
                CAT_DEBUG_ASSERT(ref_column_i < _recovery_rows);
                uint8_t * GF256_RESTRICT temp_block_dest = _recovery_blocks + _block_bytes * ref_column_i;

                // If referencing row is already copied to the recovery blocks:
                if (ref_row->Marks.Result.IsCopied) {
                    // Add this row block value to it
                    gf256_add_mem(temp_block_dest, temp_block_src, _block_bytes);
                }
                else
                {
                    const uint8_t * GF256_RESTRICT block_src = _input_blocks + _block_bytes * ref_row_i;

                    // If this is not the last block:
                    if (ref_row_i != _block_count - 1) {
                        // Add this row block value with message block to it (optimization)
                        gf256_addset_mem(temp_block_dest, temp_block_src, block_src, _block_bytes);
                    }
                    else
                    {
                        // Add with zero padding
                        gf256_addset_mem(temp_block_dest, temp_block_src, block_src, _input_final_bytes);

                        CAT_DEBUG_ASSERT(_block_bytes >= _input_final_bytes);
                        memcpy(
                            temp_block_dest + _input_final_bytes,
                            temp_block_src + _input_final_bytes,
                            _block_bytes - _input_final_bytes);
                    }

                    ref_row->Marks.Result.IsCopied = 1;
                }

                CAT_IF_ROWOP(++rowops;)
            } // end if referencing row is peeled

        } // next referencing row

        CAT_IF_DUMP(cout << endl;)

    } // next peeled row

    CAT_IF_ROWOP(cout << "PeelDiagonal used " << rowops << " row ops = "
        << rowops / (double)_block_count << "*N" << endl;)
}